

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__decode_uint16_linear_ARGB(float *decodep,int width_times_channels,void *inputp)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 (*pauVar13) [16];
  float *decode;
  float *pfVar14;
  undefined1 (*pauVar15) [16];
  float *pfVar16;
  
  pfVar2 = decodep + width_times_channels;
  if (width_times_channels < 8) {
    for (pfVar14 = decodep + 4; pfVar14 <= pfVar2; pfVar14 = pfVar14 + 4) {
      uVar3 = *inputp;
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar3;
      auVar6._12_2_ = (short)(uVar3 >> 0x30);
      auVar8._8_2_ = (short)(uVar3 >> 0x20);
      auVar8._0_8_ = uVar3;
      auVar8._10_4_ = auVar6._10_4_;
      auVar12._6_8_ = 0;
      auVar12._0_6_ = auVar8._8_6_;
      auVar10._4_2_ = (short)(uVar3 >> 0x10);
      auVar10._0_4_ = (uint)uVar3;
      auVar10._6_8_ = SUB148(auVar12 << 0x40,6);
      pfVar14[-4] = (float)auVar10._4_4_;
      pfVar14[-3] = (float)auVar8._8_4_;
      pfVar14[-2] = (float)(auVar6._10_4_ >> 0x10);
      pfVar14[-1] = (float)((uint)uVar3 & 0xffff);
      inputp = (void *)((long)inputp + 8);
    }
  }
  else {
    pfVar14 = pfVar2 + -8;
    pauVar13 = (undefined1 (*) [16])inputp;
    do {
      pfVar1 = decodep + 8;
      pfVar16 = pfVar14;
      pauVar15 = (undefined1 (*) [16])((long)inputp + (long)width_times_channels * 2 + -0x10);
      if (pfVar1 == pfVar2) {
        pfVar16 = pfVar1;
        pauVar15 = pauVar13 + 1;
      }
      if (pfVar1 <= pfVar14) {
        pauVar15 = pauVar13 + 1;
      }
      auVar4 = *pauVar13;
      if (pfVar1 <= pfVar14) {
        pfVar16 = pfVar1;
      }
      auVar5._10_2_ = 0;
      auVar5._0_10_ = auVar4._0_10_;
      auVar5._12_2_ = auVar4._6_2_;
      auVar7._8_2_ = auVar4._4_2_;
      auVar7._0_8_ = auVar4._0_8_;
      auVar7._10_4_ = auVar5._10_4_;
      auVar11._6_8_ = 0;
      auVar11._0_6_ = auVar7._8_6_;
      auVar9._4_2_ = auVar4._2_2_;
      auVar9._0_4_ = auVar4._0_4_;
      auVar9._6_8_ = SUB148(auVar11 << 0x40,6);
      *decodep = (float)auVar9._4_4_;
      decodep[1] = (float)auVar7._8_4_;
      decodep[2] = (float)(auVar5._10_4_ >> 0x10);
      decodep[3] = (float)(auVar4._0_4_ & 0xffff);
      decodep[4] = (float)auVar4._10_2_;
      decodep[5] = (float)auVar4._12_2_;
      decodep[6] = (float)auVar4._14_2_;
      decodep[7] = (float)auVar4._8_2_;
      pauVar13 = pauVar15;
      decodep = pfVar16;
    } while (pfVar1 != pfVar2);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_uint16_linear)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  unsigned short const * input = (unsigned short const *)inputp;

  #ifdef STBIR_SIMD
  unsigned short const * end_input_m8 = input + width_times_channels - 8;
  if ( width_times_channels >= 8 )
  {
    decode_end -= 8;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      #ifdef STBIR_SIMD8
      stbir__simdi i; stbir__simdi8 o;
      stbir__simdf8 of;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi8_expand_u16_to_u32( o, i );
      stbir__simdi8_convert_i32_to_float( of, o );
      stbir__decode_simdf8_flip( of );
      stbir__simdf8_store( decode + 0, of );
      #else
      stbir__simdi i, o0, o1;
      stbir__simdf of0, of1;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi_expand_u16_to_u32( o0, o1, i );
      stbir__simdi_convert_i32_to_float( of0, o0 );
      stbir__simdi_convert_i32_to_float( of1, o1 );
      stbir__decode_simdf4_flip( of0 );
      stbir__decode_simdf4_flip( of1 );
      stbir__simdf_store( decode + 0,  of0 );
      stbir__simdf_store( decode + 4,  of1 );
      #endif
      decode += 8;
      input += 8;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 8 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = ((float)(input[stbir__decode_order0]));
    decode[1-4] = ((float)(input[stbir__decode_order1]));
    decode[2-4] = ((float)(input[stbir__decode_order2]));
    decode[3-4] = ((float)(input[stbir__decode_order3]));
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = ((float)(input[stbir__decode_order0]));
    #if stbir__coder_min_num >= 2
    decode[1] = ((float)(input[stbir__decode_order1]));
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = ((float)(input[stbir__decode_order2]));
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}